

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::at<std::__cxx11::string>
          (Map<std::__cxx11::string,std::__cxx11::string> *this,
          key_arg<std::__cxx11::basic_string<char>_> *key)

{
  LogMessage *this_00;
  const_iterator it;
  LogMessage LStack_58;
  string local_48;
  iterator local_28;
  
  find<std::__cxx11::string>(&local_28,this,key);
  if (local_28.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_28.super_UntypedMapIterator.node_ + 5);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_58,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x4e8,"it != end()");
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_58,(char (*) [16])"key not found: ");
  std::__cxx11::string::string((string *)&local_48,(string *)key);
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_58)
  ;
}

Assistant:

const T& at(const key_arg<K>& key) const ABSL_ATTRIBUTE_LIFETIME_BOUND {
    const_iterator it = find(key);
    ABSL_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }